

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  value_type *__x;
  pointer pTVar1;
  pointer pAVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  bool bVar4;
  __type _Var5;
  Type TVar6;
  long lVar7;
  domain_error *this_00;
  string *shortName;
  pointer this_01;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [5];
  
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar8 = 0;
  do {
    pTVar1 = (tokens->
             super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(tokens->
                       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x28) <= uVar8)
    {
      return __return_storage_ptr__;
    }
    __x = pTVar1 + uVar8;
    pAVar2 = (this->m_options).
             super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    shortName = &pTVar1[uVar8].data;
    for (this_01 = (this->m_options).
                   super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != pAVar2;
        this_01 = this_01 + 1) {
      TVar6 = __x->type;
      if (TVar6 == ShortOpt) {
        bVar4 = Arg::hasShortName(this_01,shortName);
        if (!bVar4) {
          TVar6 = __x->type;
          goto LAB_001381b2;
        }
LAB_001381d0:
        if ((this_01->hint)._M_string_length == 0) {
          pIVar3 = (this_01->boundField).functionObj;
          (*pIVar3->_vptr_IArgFunction[3])(pIVar3,config);
        }
        else {
          pTVar1 = (tokens->
                   super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar7 = (long)(tokens->
                        super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1;
          if (uVar8 == lVar7 / 0x28 - 1U) {
LAB_00138259:
            this_00 = (domain_error *)__cxa_allocate_exception(0x10,0x28,lVar7 % 0x28);
            std::operator+(local_d0,"Expected argument to option ",shortName);
            std::domain_error::domain_error(this_00,(string *)local_d0);
            __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
          }
          uVar8 = uVar8 + 1;
          if (pTVar1[uVar8].type != Positional) goto LAB_00138259;
          pIVar3 = (this_01->boundField).functionObj;
          (*pIVar3->_vptr_IArgFunction[2])(pIVar3,config,&pTVar1[uVar8].data);
        }
        if (this_01 != pAVar2) goto LAB_0013823a;
        break;
      }
LAB_001381b2:
      if (TVar6 == LongOpt) {
        _Var5 = std::operator==(shortName,&this_01->longName);
        if (_Var5) goto LAB_001381d0;
      }
    }
    std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
              (__return_storage_ptr__,__x);
LAB_0013823a:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    throw std::domain_error( "Expected argument to option " + token.data );
                                arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.setFlag( config );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        throw std::runtime_error( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd )
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }